

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

vm_obj_id_t CVmObjFileName::create_from_local(char *str,size_t len)

{
  vm_obj_id_t obj_id;
  CVmObjFileName *this;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
  this = (CVmObjFileName *)CVmObject::operator_new(0x10,obj_id);
  CVmObjFileName(this,0,str,len);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjFileName::create_from_local(VMG_ const char *str, size_t len)
{
    /* allocate the new ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* create the object */
    new (vmg_ id) CVmObjFileName(vmg_ 0, str, len);

    /* return the new ID */
    return id;
}